

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::generate_set<std::vector<char_const*,std::allocator<char_const*>>>
                   (vector<const_char_*,_std::allocator<const_char_*>_> *set)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  allocator<char> *in_stack_ffffffffffffff68;
  char __c;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 local_48 [54];
  undefined1 local_11;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_10;
  
  local_11 = 0;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffee;
  pbVar1 = in_RDI;
  local_10 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (pbVar2,(size_type)pbVar1,(char)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff68);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffee);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           smart_deref<const_std::vector<const_char_*,_std::allocator<const_char_*>_>,_(CLI::detail::enabler)0>
                     (local_10);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_71;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  join<std::vector<char_const*,std::allocator<char_const*>>,CLI::detail::generate_set<std::vector<char_const*,std::allocator<char_const*>>>(std::vector<char_const*,std::allocator<char_const*>>const&)::_lambda(char_const*const&)_1_,void>
            (local_48,pbVar1,&stack0xffffffffffffff90);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_RDI,pbVar1);
  __c = (char)((ulong)pbVar1 >> 0x38);
  ::std::__cxx11::string::~string(pbVar2);
  ::std::__cxx11::string::~string(pbVar2);
  ::std::allocator<char>::~allocator(&local_71);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (in_RDI,__c);
  return in_RDI;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}